

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::DefineCachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ParseNodeFnc *pPVar4;
  undefined4 *puVar5;
  FunctionBody *this_01;
  ParseNodeFnc *pPVar6;
  uint byteCount;
  ulong uVar7;
  AuxArray<unsigned_int> *local_70;
  AuxArray<unsigned_int> *slotIdInCachedScopeToNestedIndexArray;
  FuncInfo *funcInfoParent_local;
  FuncInfoArray *info;
  AuxArray<unsigned_int> **local_50;
  AuxArray<unsigned_int> **local_48;
  anon_class_8_1_3fcf6586 local_40;
  uint local_34 [2];
  uint slotCount;
  
  pPVar6 = funcInfoParent->root;
  local_40.fn = (anon_class_24_3_523878ff *)local_34;
  local_34[0] = 0;
  slotIdInCachedScopeToNestedIndexArray = (AuxArray<unsigned_int> *)funcInfoParent;
  pPVar4 = ParseNode::AsParseNodeFnc(&pPVar6->super_ParseNode);
  info = (FuncInfoArray *)&local_40;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
  ::anon_class_8_1_3fcf6586::operator()
            ((anon_class_8_1_3fcf6586 *)&info,pPVar4->pnodeScopes->pnodeScopes);
  if (pPVar4->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1051:26)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&info,pPVar4->pnodeBodyScope->pnodeScopes);
  }
  uVar7 = (ulong)local_34[0];
  if (uVar7 != 0) {
    if (0xfffffff < local_34[0]) {
      Js::Throw::OutOfMemory();
    }
    this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0080c991;
      *puVar5 = 0;
    }
    uVar7 = uVar7 << 3;
    funcInfoParent_local =
         (FuncInfo *)
         Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                   (this_00,uVar7 | 4);
    if (funcInfoParent_local == (FuncInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0080c991:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    funcInfoParent_local->inlineCacheCount = local_34[0];
    this_01 = FuncInfo::GetParsedFunctionBody((FuncInfo *)slotIdInCachedScopeToNestedIndexArray);
    local_70 = Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(this_01,local_34[0]);
    local_48 = &local_70;
    local_34[0] = 0;
    info = (FuncInfoArray *)&funcInfoParent_local;
    local_50 = (AuxArray<unsigned_int> **)local_34;
    pPVar4 = ParseNode::AsParseNodeFnc(&pPVar6->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
    ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar4->pnodeScopes->pnodeScopes);
    if (pPVar4->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1080:24)>
      ::anon_class_8_1_3fcf6586::operator()(&local_40,pPVar4->pnodeBodyScope->pnodeScopes);
    }
    byteCount = (uint)uVar7 | 4;
    Js::ByteCodeWriter::AuxNoReg
              (&this->m_writer,InitCachedFuncs,funcInfoParent_local,byteCount,byteCount);
    local_34[0] = 0;
    local_50 = &slotIdInCachedScopeToNestedIndexArray;
    info = (FuncInfoArray *)this;
    local_48 = (AuxArray<unsigned_int> **)local_34;
    pPVar6 = ParseNode::AsParseNodeFnc(&pPVar6->super_ParseNode);
    local_40.fn = (anon_class_24_3_523878ff *)&info;
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&local_40,pPVar6->pnodeScopes->pnodeScopes);
    if (pPVar6->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1102:34)>
      ::anon_class_8_1_3fcf6586::operator()
                ((anon_class_8_1_3fcf6586 *)&local_40,pPVar6->pnodeBodyScope->pnodeScopes);
    }
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<Js::FuncInfoEntry>>
              (this->alloc,(AuxArray<Js::FuncInfoEntry> *)funcInfoParent_local,uVar7);
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineCachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    uint slotCount = 0;

    auto countFncSlots = [&](ParseNode *pnodeFnc)
    {
        if (pnodeFnc->AsParseNodeFnc()->GetFuncSymbol() != nullptr && pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, countFncSlots);

    if (slotCount == 0)
    {
        return;
    }

    size_t extraBytesActual = AllocSizeMath::Mul(slotCount, sizeof(Js::FuncInfoEntry));
    // Reg2Aux takes int for byteCount so we need to convert to int. OOM if we can't because it would truncate data.
    if (extraBytesActual > INT_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    int extraBytes = (int)extraBytesActual;

    Js::FuncInfoArray *info = AnewPlus(alloc, extraBytes, Js::FuncInfoArray, slotCount);

    // slotCount is guaranteed to be non-zero here.
    Js::AuxArray<uint32> * slotIdInCachedScopeToNestedIndexArray = funcInfoParent->GetParsedFunctionBody()->AllocateSlotIdInCachedScopeToNestedIndexArray(slotCount);

    slotCount = 0;

    auto fillEntries = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (sym != nullptr && (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport()))
        {
            AssertMsg(!pnodeFnc->AsParseNodeFnc()->IsGenerator(), "Generator functions are not supported by InitCachedFuncs but since they always escape they should disable function caching");
            Js::FuncInfoEntry *entry = &info->elements[slotCount];
            entry->nestedIndex = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            entry->scopeSlot = sym->GetScopeSlot();

            slotIdInCachedScopeToNestedIndexArray->elements[slotCount] = pnodeFnc->AsParseNodeFnc()->nestedIndex;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, fillEntries);

    m_writer.AuxNoReg(Js::OpCode::InitCachedFuncs,
        info,
        sizeof(Js::FuncInfoArray) + extraBytes,
        sizeof(Js::FuncInfoArray) + extraBytes);

    slotCount = 0;
    auto defineOrGetCachedFunc = [&](ParseNode *pnodeFnc)
    {
        Symbol *sym = pnodeFnc->AsParseNodeFnc()->GetFuncSymbol();
        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration())
        {
            // Do we need to define the function here (i.e., is it not one of our cached locals)?
            // Only happens if the sym is null (e.g., function x.y(){}).
            if (sym == nullptr)
            {
                this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            }
            else if (!sym->IsInSlot(this, funcInfoParent) && sym->GetLocation() != Js::Constants::NoRegister)
            {
                // If it was defined by InitCachedFuncs, do we need to put it in a register rather than a slot?
                m_writer.Reg1Unsigned1(Js::OpCode::GetCachedFunc, sym->GetLocation(), slotCount);
            }
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
            slotCount++;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineOrGetCachedFunc);

    AdeletePlus(alloc, extraBytes, info);
}